

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_help.cpp
# Opt level: O2

void __thiscall
Help_BuildDefaultCategoryOnly_Test::TestBody(Help_BuildDefaultCategoryOnly_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  initializer_list<pstore::command_line::option_*> __l;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_208;
  AssertHelper local_200;
  AssertionResult gtest_ar;
  options_container container;
  categories_collection actual;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  option2;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  option1;
  
  pstore::command_line::
  opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>::
  opt<char[5],pstore::command_line::details::positional>
            ((opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>> *)
             &option1,(char (*) [5])"arg1",(positional *)&pstore::command_line::positional);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::opt<char[5]>(&option2,(char (*) [5])"arg2");
  __l._M_len = 2;
  __l._M_array = (iterator)&actual;
  actual._M_t._M_impl._0_8_ = &option1;
  actual._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &option2;
  std::__cxx11::
  list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::list
            (&container,__l,(allocator_type *)&gtest_ar);
  pstore::command_line::details::build_categories(&actual,(option *)0x0,&container);
  local_208._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       actual._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_200.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&gtest_ar,"actual.size ()","1U",(unsigned_long *)&local_208,
             (uint *)&local_200);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_208);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
               ,0x4f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if ((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
         *)local_208._M_head_impl !=
        (opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
         *)0x0) {
      (**(code **)(*(long *)local_208._M_head_impl + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_208._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperEQ<pstore::command_line::option_category_const*,decltype(nullptr)>
              ((internal *)&gtest_ar,"first.first","nullptr",
               (option_category **)(actual._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1)
               ,&local_208._M_head_impl);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_208);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
                 ,0x51,pcVar1);
      testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_208);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      if (local_208._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_208._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_208._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&option2;
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<pstore::command_line::opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>*>>>
    ::operator()(&gtest_ar,(char *)&local_208,
                 (set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>
                  *)"first.second");
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_208);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
                 ,0x52,pcVar1);
      testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_208);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      if ((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
           *)local_208._M_head_impl !=
          (opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
           *)0x0) {
        (**(code **)(*(long *)local_208._M_head_impl + 8))();
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  _Rb_tree<const_pstore::command_line::option_category_*,_std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>,_std::_Select1st<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
  ::~_Rb_tree(&actual._M_t);
  std::__cxx11::
  _List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::
  _M_clear(&container.
            super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
          );
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~opt(&option2);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~opt(&option1);
  return;
}

Assistant:

TEST_F (Help, BuildDefaultCategoryOnly) {
    {
        opt<std::string> option1{"arg1", positional};
        opt<std::string> option2{"arg2"};
        option::options_container container{&option1, &option2};
        details::categories_collection const actual =
            details::build_categories (nullptr, container);

        ASSERT_EQ (actual.size (), 1U);
        auto const & first = *actual.begin ();
        EXPECT_EQ (first.first, nullptr);
        EXPECT_THAT (first.second, testing::ElementsAre (&option2));
    }
}